

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool wallet::anon_unknown_1::HaveKeys
               (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *pubkeys,LegacyDataSPKM *keystore)

{
  pointer pvVar1;
  pointer pvVar2;
  int iVar3;
  pointer pvVar4;
  long in_FS_OFFSET;
  bool bVar5;
  CKeyID keyID;
  CPubKey local_8d;
  CKeyID local_4c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar1 = (pubkeys->
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (pubkeys->
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = pvVar1 == pvVar2;
  if (!bVar5) {
    CPubKey::Set<unsigned_char_const*>
              (&local_8d,
               (pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    CPubKey::GetID(&local_4c,&local_8d);
    iVar3 = (*(keystore->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1d])(keystore,&local_4c);
    if ((char)iVar3 != '\0') {
      do {
        pvVar4 = pvVar1 + 1;
        bVar5 = pvVar4 == pvVar2;
        if (bVar5) break;
        CPubKey::Set<unsigned_char_const*>
                  (&local_8d,
                   (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start,
                   pvVar1[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        CPubKey::GetID(&local_4c,&local_8d);
        iVar3 = (*(keystore->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1d])(keystore,&local_4c)
        ;
        pvVar1 = pvVar4;
      } while ((char)iVar3 != '\0');
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool HaveKeys(const std::vector<valtype>& pubkeys, const LegacyDataSPKM& keystore)
{
    for (const valtype& pubkey : pubkeys) {
        CKeyID keyID = CPubKey(pubkey).GetID();
        if (!keystore.HaveKey(keyID)) return false;
    }
    return true;
}